

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::GuessLibrarySOName(string *fullPath,string *soname)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  string name;
  cmELF elf;
  string local_60;
  cmELF local_40;
  
  cmELF::cmELF(&local_40,(fullPath->_M_dataplus)._M_p);
  bVar2 = cmELF::Valid(&local_40);
  if (bVar2) {
    bVar2 = cmELF::GetSOName(&local_40,soname);
  }
  else {
    bVar2 = cmsys::SystemTools::FileIsSymlink(fullPath);
    if (bVar2) {
      bVar2 = cmsys::SystemTools::ReadSymlink(fullPath,soname);
      if (bVar2) {
        cmsys::SystemTools::GetFilenamePath(&local_60,soname);
        sVar1 = local_60._M_string_length;
        std::__cxx11::string::~string((string *)&local_60);
        if ((string *)sVar1 == (string *)0x0) {
          cmsys::SystemTools::GetFilenameName(&local_60,fullPath);
          if (local_60._M_string_length < (string *)soname->_M_string_length) {
            iVar3 = std::__cxx11::string::compare
                              ((ulong)soname,0,(string *)local_60._M_string_length);
            bVar2 = iVar3 == 0;
          }
          else {
            bVar2 = false;
          }
          std::__cxx11::string::~string((string *)&local_60);
          goto LAB_0019bf69;
        }
      }
    }
    bVar2 = false;
  }
LAB_0019bf69:
  cmELF::~cmELF(&local_40);
  return bVar2;
}

Assistant:

bool cmSystemTools::GuessLibrarySOName(std::string const& fullPath,
                                       std::string& soname)
{
// For ELF shared libraries use a real parser to get the correct
// soname.
#if defined(CMAKE_USE_ELF_PARSER)
  cmELF elf(fullPath.c_str());
  if (elf) {
    return elf.GetSOName(soname);
  }
#endif

  // If the file is not a symlink we have no guess for its soname.
  if (!cmSystemTools::FileIsSymlink(fullPath)) {
    return false;
  }
  if (!cmSystemTools::ReadSymlink(fullPath, soname)) {
    return false;
  }

  // If the symlink has a path component we have no guess for the soname.
  if (!cmSystemTools::GetFilenamePath(soname).empty()) {
    return false;
  }

  // If the symlink points at an extended version of the same name
  // assume it is the soname.
  std::string name = cmSystemTools::GetFilenameName(fullPath);
  return soname.length() > name.length() &&
    soname.compare(0, name.length(), name) == 0;
}